

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.hpp
# Opt level: O0

char * vkt::tessellation::getGeometryShaderOutputPrimitiveTypeShaderName
                 (TessPrimitiveType type,bool usePointMode)

{
  bool usePointMode_local;
  char *pcStack_10;
  TessPrimitiveType type_local;
  
  if (usePointMode) {
    pcStack_10 = "points";
  }
  else if (type < TESSPRIMITIVETYPE_ISOLINES) {
    pcStack_10 = "triangle_strip";
  }
  else if (type == TESSPRIMITIVETYPE_ISOLINES) {
    pcStack_10 = "line_strip";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static inline const char* getGeometryShaderOutputPrimitiveTypeShaderName (const TessPrimitiveType type, const bool usePointMode)
{
	if (usePointMode)
		return "points";

	switch (type)
	{
		case TESSPRIMITIVETYPE_TRIANGLES:
		case TESSPRIMITIVETYPE_QUADS:
			return "triangle_strip";

		case TESSPRIMITIVETYPE_ISOLINES:
			return "line_strip";

		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}